

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::GetValue(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  bool bVar1;
  const_reference pvVar2;
  pointer ppVar3;
  element_type *peVar4;
  element_type *this;
  undefined1 local_70 [24];
  CollectionItrPair local_58;
  undefined1 local_30 [8];
  ScriptIPtr s;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params;
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)local_30);
  pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                     ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                      s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,0);
  bVar1 = Variant::IsCollectionItr(pvVar2);
  if (bVar1) {
    pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                        s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,0);
    Variant::GetCollectionItr((CollectionItrPair *)(local_70 + 0x18),pvVar2);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_> *)
                        (local_70 + 0x18));
    Variant::Variant(__return_storage_ptr__,&ppVar3->second);
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
    ::~pair((pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
             *)(local_70 + 0x18));
  }
  else {
    pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                        s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,0);
    bVar1 = Variant::IsCoroutine(pvVar2);
    if (bVar1) {
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                 s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,0);
      Variant::GetCoroutine((Variant *)local_70);
      peVar4 = std::__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
      (*peVar4->_vptr_ICoroutine[1])(__return_storage_ptr__);
      std::shared_ptr<Jinx::ICoroutine>::~shared_ptr((shared_ptr<Jinx::ICoroutine> *)local_70);
    }
    else {
      this = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      Script::Error(this,"\'get value\' called with invalid param type");
      Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  local_70._20_4_ = 1;
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetValue(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params[0].IsCollectionItr())
		{
			return params[0].GetCollectionItr().first->second;
		}
		else if (params[0].IsCoroutine())
		{
			return params[0].GetCoroutine()->GetReturnValue();
		}
		s->Error("'get value' called with invalid param type");
		return nullptr;
	}